

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddTriangleMeshConcave
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          shared_ptr<chrono::geometry::ChTriangleMesh> *trimesh,ChVector<double> *pos,
          ChMatrix33<double> *rot)

{
  element_type *peVar1;
  ChCollisionModelBullet *this_00;
  int iVar2;
  int iVar3;
  cbtTriangleMesh *this_01;
  ChCollisionShapeBullet *this_02;
  cbtGImpactMeshShape *this_03;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001284 [12];
  shared_ptr<chrono::ChMaterialSurface> local_180;
  ChVector<double> *local_170;
  ChMatrix33<double> *local_168;
  shared_ptr<chrono::ChMaterialSurface> *local_160;
  ChCollisionModelBullet *local_158;
  cbtVector3 local_150;
  cbtVector3 local_140;
  cbtVector3 local_130;
  undefined1 local_120 [56];
  double local_e8;
  double local_e0;
  double local_d8;
  undefined1 local_d0 [32];
  double local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_80 [8];
  double local_78;
  double local_70;
  double local_68;
  
  iVar2 = (*(((trimesh->
              super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_ChGeometry)._vptr_ChGeometry[0xd])();
  if (iVar2 != 0) {
    local_170 = pos;
    local_168 = rot;
    local_160 = material;
    local_158 = this;
    this_01 = (cbtTriangleMesh *)cbtAlignedAllocInternal(0xf0,0x10);
    cbtTriangleMesh::cbtTriangleMesh(this_01,true,true);
    iVar3 = (*(((trimesh->
                super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->super_ChGeometry)._vptr_ChGeometry[0xd])();
    if (0 < iVar3) {
      uVar5 = 0;
      do {
        peVar1 = (trimesh->
                 super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xe])(local_80,peVar1,uVar5);
        auVar6._0_4_ = (float)local_78;
        auVar6._4_12_ = in_register_00001284;
        auVar9._0_4_ = (float)local_70;
        auVar9._4_12_ = in_register_00001284;
        auVar6 = vinsertps_avx(auVar6,auVar9,0x10);
        auVar10._0_4_ = (float)local_68;
        auVar10._4_12_ = in_register_00001284;
        local_130.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,auVar10,0x28);
        peVar1 = (trimesh->
                 super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xe])(local_d0,peVar1,uVar5);
        auVar7._0_4_ = (float)local_b0;
        auVar7._4_12_ = in_register_00001284;
        auVar11._0_4_ = (float)local_a8;
        auVar11._4_12_ = in_register_00001284;
        auVar6 = vinsertps_avx(auVar7,auVar11,0x10);
        auVar12._0_4_ = (float)local_a0;
        auVar12._4_12_ = in_register_00001284;
        local_140.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,auVar12,0x28);
        peVar1 = (trimesh->
                 super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xe])(local_120,peVar1,uVar5);
        auVar8._0_4_ = (float)local_e8;
        auVar8._4_12_ = in_register_00001284;
        auVar13._0_4_ = (float)local_e0;
        auVar13._4_12_ = in_register_00001284;
        auVar6 = vinsertps_avx(auVar8,auVar13,0x10);
        auVar14._0_4_ = (float)local_d8;
        auVar14._4_12_ = in_register_00001284;
        local_150.m_floats = (cbtScalar  [4])vinsertps_avx(auVar6,auVar14,0x28);
        cbtTriangleMesh::addTriangle(this_01,&local_130,&local_140,&local_150,true);
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        iVar3 = (*(((trimesh->
                    super___shared_ptr<chrono::geometry::ChTriangleMesh,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->super_ChGeometry)._vptr_ChGeometry[0xd])();
      } while ((int)uVar4 < iVar3);
    }
    this_00 = local_158;
    (*(local_158->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(0,local_158);
    this_02 = (ChCollisionShapeBullet *)::operator_new(0x28);
    local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (local_160->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChCollisionShapeBullet::ChCollisionShapeBullet(this_02,TRIANGLEMESH,&local_180);
    if (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_180.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    this_03 = (cbtGImpactMeshShape *)cbtAlignedAllocInternal(0xe8,0x10);
    cbtGImpactMeshShape::cbtGImpactMeshShape(this_03,(cbtStridingMeshInterface *)this_01);
    (this_03->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtGImpactMeshShape_handlemesh_00b642c0;
    this_03[1].super_cbtGImpactShapeInterface.super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape = (_func_int **)this_01;
    (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this_00);
    (*(this_03->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0xb])(this_03);
    if ((this_03->super_cbtGImpactShapeInterface).m_needs_update == true) {
      (*(this_03->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0x11])(this_03);
      (this_03->super_cbtGImpactShapeInterface).m_needs_update = false;
    }
    this_02->m_bt_shape = (cbtCollisionShape *)this_03;
    injectShape(this_00,local_170,local_168,this_02);
  }
  return iVar2 != 0;
}

Assistant:

bool ChCollisionModelBullet::AddTriangleMeshConcave(std::shared_ptr<ChMaterialSurface> material,
                                                    std::shared_ptr<geometry::ChTriangleMesh> trimesh,
                                                    const ChVector<>& pos,
                                                    const ChMatrix33<>& rot) {
    if (!trimesh->getNumTriangles())
        return false;

    cbtTriangleMesh* bulletMesh = new cbtTriangleMesh;
    for (int i = 0; i < trimesh->getNumTriangles(); i++) {
        // bulletMesh->m_weldingThreshold = ...
        bulletMesh->addTriangle(ChVectToBullet(trimesh->getTriangle(i).p1), ChVectToBullet(trimesh->getTriangle(i).p2),
                                ChVectToBullet(trimesh->getTriangle(i).p3),
                                true);  // try to remove duplicate vertices
    }

    SetSafeMargin(0);

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::TRIANGLEMESH, material);

    // Use the GImpact custom mesh-mesh algorithm
    auto bt_shape = new cbtGImpactMeshShape_handlemesh(bulletMesh);
    bt_shape->setMargin((cbtScalar)GetEnvelope());
    bt_shape->updateBound();
    shape->m_bt_shape = bt_shape;

    injectShape(pos, rot, shape);
    return true;
}